

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::CloseButton(ImGuiID id,ImVec2 *pos,float radius)

{
  bool bVar1;
  float in_XMM0_Da;
  ImU32 cross_col;
  float cross_extent;
  ImVec2 center;
  bool pressed;
  bool held;
  bool hovered;
  bool is_clipped;
  ImRect bb;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImRect *in_stack_fffffffffffffeb8;
  int num_segments;
  ImVec2 *this;
  undefined8 in_stack_fffffffffffffec0;
  ImVec2 *in_stack_fffffffffffffec8;
  ImDrawList *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  ImGuiButtonFlags in_stack_fffffffffffffedc;
  bool *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  uint uVar2;
  undefined4 in_stack_fffffffffffffeec;
  ImGuiID in_stack_fffffffffffffef4;
  ImRect *in_stack_fffffffffffffef8;
  undefined8 in_stack_ffffffffffffff08;
  ImVec2 *this_00;
  ImVec2 *in_stack_ffffffffffffff10;
  ImDrawList *b;
  ImDrawList *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  float in_stack_ffffffffffffff24;
  ImVec2 local_b4;
  ImVec2 local_ac;
  ImVec2 local_a4;
  ImVec2 local_9c;
  ImVec2 local_94;
  ImVec2 local_8c;
  ImVec2 local_84;
  ImVec2 local_7c;
  ImVec2 local_74;
  ImU32 local_6c;
  float local_68;
  ImVec2 local_64;
  byte local_5c;
  byte local_5a;
  byte local_59;
  ImVec2 local_58;
  ImVec2 local_50;
  ImVec2 local_48;
  ImVec2 local_40;
  ImRect local_38;
  ImGuiWindow *local_28;
  ImGuiContext *local_20;
  float local_14;
  bool local_1;
  
  local_20 = GImGui;
  local_28 = GImGui->CurrentWindow;
  local_14 = in_XMM0_Da;
  ImVec2::ImVec2(&local_48,in_XMM0_Da,in_XMM0_Da);
  local_40 = operator-(&in_stack_fffffffffffffeb8->Min,(ImVec2 *)0x176922);
  ImVec2::ImVec2(&local_58,local_14,local_14);
  local_50 = operator+(&in_stack_fffffffffffffeb8->Min,(ImVec2 *)0x176971);
  ImRect::ImRect(&local_38,&local_40,&local_50);
  bVar1 = ItemAdd((ImRect *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                  (ImGuiID)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                  (ImRect *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  local_59 = (bVar1 ^ 0xffU) & 1;
  local_5c = ButtonBehavior(in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,
                            (bool *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                            in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
  local_1 = (bool)local_5c;
  if ((local_59 & 1) == 0) {
    local_64 = ImRect::GetCenter(in_stack_fffffffffffffeb8);
    num_segments = (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
    if ((local_5a & 1) != 0) {
      in_stack_ffffffffffffff18 = local_28->DrawList;
      in_stack_ffffffffffffff24 = ImMax<float>(2.0,local_14);
      GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                  SUB84(in_stack_fffffffffffffed0,0));
      ImDrawList::AddCircleFilled
                (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                 (float)((ulong)in_stack_fffffffffffffec0 >> 0x20),(ImU32)in_stack_fffffffffffffec0,
                 num_segments);
    }
    local_68 = local_14 * 0.7071 + -1.0;
    local_6c = GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                           SUB84(in_stack_fffffffffffffed0,0));
    this = &local_74;
    ImVec2::ImVec2(this,0.5,0.5);
    operator-=(&local_64,this);
    ImVec2::ImVec2(&local_84,local_68,local_68);
    local_7c = operator+(this,(ImVec2 *)0x176b55);
    uVar2 = 0x80000000;
    ImVec2::ImVec2(&local_94,-local_68,-local_68);
    local_8c = operator+(this,(ImVec2 *)0x176b9b);
    ImDrawList::AddLine((ImDrawList *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                        (ImVec2 *)in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                        (ImU32)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                        (float)in_stack_ffffffffffffff08);
    b = local_28->DrawList;
    ImVec2::ImVec2(&local_a4,local_68,(float)((uint)local_68 ^ uVar2));
    local_9c = operator+(this,(ImVec2 *)0x176c18);
    this_00 = &local_b4;
    ImVec2::ImVec2(this_00,(float)((uint)local_68 ^ uVar2),local_68);
    local_ac = operator+(this,(ImVec2 *)0x176c57);
    ImDrawList::AddLine((ImDrawList *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                        (ImVec2 *)in_stack_ffffffffffffff18,(ImVec2 *)b,
                        (ImU32)((ulong)this_00 >> 0x20),SUB84(this_00,0));
    local_1 = (bool)(local_5c & 1);
  }
  return local_1;
}

Assistant:

bool ImGui::CloseButton(ImGuiID id, const ImVec2& pos, float radius)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // We intentionally allow interaction when clipped so that a mechanical Alt,Right,Validate sequence close a window.
    // (this isn't the regular behavior of buttons, but it doesn't affect the user much because navigation tends to keep items visible).
    const ImRect bb(pos - ImVec2(radius,radius), pos + ImVec2(radius,radius));
    bool is_clipped = !ItemAdd(bb, id);

    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held);
    if (is_clipped)
        return pressed;

    // Render
    ImVec2 center = bb.GetCenter();
    if (hovered)
        window->DrawList->AddCircleFilled(center, ImMax(2.0f, radius), GetColorU32(held ? ImGuiCol_ButtonActive : ImGuiCol_ButtonHovered), 9);

    float cross_extent = (radius * 0.7071f) - 1.0f;
    ImU32 cross_col = GetColorU32(ImGuiCol_Text);
    center -= ImVec2(0.5f, 0.5f);
    window->DrawList->AddLine(center + ImVec2(+cross_extent,+cross_extent), center + ImVec2(-cross_extent,-cross_extent), cross_col, 1.0f);
    window->DrawList->AddLine(center + ImVec2(+cross_extent,-cross_extent), center + ImVec2(-cross_extent,+cross_extent), cross_col, 1.0f);

    return pressed;
}